

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-literal.cc
# Opt level: O1

void __thiscall ParseDouble_RoundingSpec_Test::TestBody(ParseDouble_RoundingSpec_Test *this)

{
  long lVar1;
  
  lVar1 = 8;
  do {
    anon_unknown.dwarf_b87ac::AssertHexDoubleEquals
              (*(uint64_t *)((long)&TestBody::kTests[0].input + lVar1),
               *(char **)((long)&ParseFloat_RoundingSpec_Test::TestBody::kTests[0x80].output + lVar1
                         ));
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x8c8);
  return;
}

Assistant:

TEST(ParseDouble, RoundingSpec) {
  static const struct {
    const char* input;
    uint64_t output;
  } kTests[] = {
    {"+0x1.000000000000080000000000p-600", 1905022642377719808ull},
    {"-0x1.000000000000080000000000p-600", 11128394679232495616ull},
    {"+0x1.000000000000080000000001p-600", 1905022642377719809ull},
    {"-0x1.000000000000080000000001p-600", 11128394679232495617ull},
    {"+0x1.0000000000000fffffffffffp-600", 1905022642377719809ull},
    {"-0x1.0000000000000fffffffffffp-600", 11128394679232495617ull},
    {"+0x1.000000000000100000000000p-600", 1905022642377719809ull},
    {"-0x1.000000000000100000000000p-600", 11128394679232495617ull},
    {"+0x1.000000000000100000000001p-600", 1905022642377719809ull},
    {"-0x1.000000000000100000000001p-600", 11128394679232495617ull},
    {"+0x1.00000000000017ffffffffffp-600", 1905022642377719809ull},
    {"-0x1.00000000000017ffffffffffp-600", 11128394679232495617ull},
    {"+0x1.000000000000180000000000p-600", 1905022642377719810ull},
    {"-0x1.000000000000180000000000p-600", 11128394679232495618ull},
    {"+0x1.000000000000180000000001p-600", 1905022642377719810ull},
    {"-0x1.000000000000180000000001p-600", 11128394679232495618ull},
    {"+0x1.0000000000001fffffffffffp-600", 1905022642377719810ull},
    {"-0x1.0000000000001fffffffffffp-600", 11128394679232495618ull},
    {"+0x1.000000000000200000000000p-600", 1905022642377719810ull},
    {"-0x1.000000000000200000000000p-600", 11128394679232495618ull},
    {"+0x1.000000000000200000000001p-600", 1905022642377719810ull},
    {"-0x1.000000000000200000000001p-600", 11128394679232495618ull},
    {"+0x1.00000000000027ffffffffffp-600", 1905022642377719810ull},
    {"-0x1.00000000000027ffffffffffp-600", 11128394679232495618ull},
    {"+0x1.000000000000280000000001p-600", 1905022642377719811ull},
    {"-0x1.000000000000280000000001p-600", 11128394679232495619ull},
    {"+0x8000000.000000400000000000p-627", 1905022642377719808ull},
    {"-0x8000000.000000400000000000p-627", 11128394679232495616ull},
    {"+0x8000000.000000400000000001p-627", 1905022642377719809ull},
    {"-0x8000000.000000400000000001p-627", 11128394679232495617ull},
    {"+0x8000000.0000007fffffffffffp-627", 1905022642377719809ull},
    {"-0x8000000.0000007fffffffffffp-627", 11128394679232495617ull},
    {"+0x8000000.000000800000000000p-627", 1905022642377719809ull},
    {"-0x8000000.000000800000000000p-627", 11128394679232495617ull},
    {"+0x8000000.000000800000000001p-627", 1905022642377719809ull},
    {"-0x8000000.000000800000000001p-627", 11128394679232495617ull},
    {"+0x8000000.000000bfffffffffffp-627", 1905022642377719809ull},
    {"-0x8000000.000000bfffffffffffp-627", 11128394679232495617ull},
    {"+0x8000000.000000c00000000000p-627", 1905022642377719810ull},
    {"-0x8000000.000000c00000000000p-627", 11128394679232495618ull},
    {"+0x8000000.000000c00000000001p-627", 1905022642377719810ull},
    {"-0x8000000.000000c00000000001p-627", 11128394679232495618ull},
    {"+0x8000000.000000ffffffffffffp-627", 1905022642377719810ull},
    {"-0x8000000.000000ffffffffffffp-627", 11128394679232495618ull},
    {"+0x8000000.000001000000000000p-627", 1905022642377719810ull},
    {"-0x8000000.000001000000000000p-627", 11128394679232495618ull},
    {"+0x8000000.000001000000000001p-627", 1905022642377719810ull},
    {"-0x8000000.000001000000000001p-627", 11128394679232495618ull},
    {"+0x8000000.0000013fffffffffffp-627", 1905022642377719810ull},
    {"-0x8000000.0000013fffffffffffp-627", 11128394679232495618ull},
    {"+0x8000000.000001400000000001p-627", 1905022642377719811ull},
    {"-0x8000000.000001400000000001p-627", 11128394679232495619ull},
    {"+0x1.000000000000080000000000p+600", 7309342195222315008ull},
    {"-0x1.000000000000080000000000p+600", 16532714232077090816ull},
    {"+0x1.000000000000080000000001p+600", 7309342195222315009ull},
    {"-0x1.000000000000080000000001p+600", 16532714232077090817ull},
    {"+0x1.0000000000000fffffffffffp+600", 7309342195222315009ull},
    {"-0x1.0000000000000fffffffffffp+600", 16532714232077090817ull},
    {"+0x1.000000000000100000000000p+600", 7309342195222315009ull},
    {"-0x1.000000000000100000000000p+600", 16532714232077090817ull},
    {"+0x1.000000000000100000000001p+600", 7309342195222315009ull},
    {"-0x1.000000000000100000000001p+600", 16532714232077090817ull},
    {"+0x1.00000000000017ffffffffffp+600", 7309342195222315009ull},
    {"-0x1.00000000000017ffffffffffp+600", 16532714232077090817ull},
    {"+0x1.000000000000180000000000p+600", 7309342195222315010ull},
    {"-0x1.000000000000180000000000p+600", 16532714232077090818ull},
    {"+0x1.000000000000180000000001p+600", 7309342195222315010ull},
    {"-0x1.000000000000180000000001p+600", 16532714232077090818ull},
    {"+0x1.0000000000001fffffffffffp+600", 7309342195222315010ull},
    {"-0x1.0000000000001fffffffffffp+600", 16532714232077090818ull},
    {"+0x1.000000000000200000000000p+600", 7309342195222315010ull},
    {"-0x1.000000000000200000000000p+600", 16532714232077090818ull},
    {"+0x1.000000000000200000000001p+600", 7309342195222315010ull},
    {"-0x1.000000000000200000000001p+600", 16532714232077090818ull},
    {"+0x1.00000000000027ffffffffffp+600", 7309342195222315010ull},
    {"-0x1.00000000000027ffffffffffp+600", 16532714232077090818ull},
    {"+0x1.000000000000280000000000p+600", 7309342195222315010ull},
    {"-0x1.000000000000280000000000p+600", 16532714232077090818ull},
    {"+0x1.000000000000280000000001p+600", 7309342195222315011ull},
    {"-0x1.000000000000280000000001p+600", 16532714232077090819ull},
    {"+0x2000000000000100000000000", 5044031582654955520ull},
    {"-0x2000000000000100000000000", 14267403619509731328ull},
    {"+0x2000000000000100000000001", 5044031582654955521ull},
    {"-0x2000000000000100000000001", 14267403619509731329ull},
    {"+0x20000000000001fffffffffff", 5044031582654955521ull},
    {"-0x20000000000001fffffffffff", 14267403619509731329ull},
    {"+0x2000000000000200000000000", 5044031582654955521ull},
    {"-0x2000000000000200000000000", 14267403619509731329ull},
    {"+0x2000000000000200000000001", 5044031582654955521ull},
    {"-0x2000000000000200000000001", 14267403619509731329ull},
    {"+0x20000000000002fffffffffff", 5044031582654955521ull},
    {"-0x20000000000002fffffffffff", 14267403619509731329ull},
    {"+0x2000000000000300000000000", 5044031582654955522ull},
    {"-0x2000000000000300000000000", 14267403619509731330ull},
    {"+0x2000000000000300000000001", 5044031582654955522ull},
    {"-0x2000000000000300000000001", 14267403619509731330ull},
    {"+0x20000000000003fffffffffff", 5044031582654955522ull},
    {"-0x20000000000003fffffffffff", 14267403619509731330ull},
    {"+0x2000000000000400000000000", 5044031582654955522ull},
    {"-0x2000000000000400000000000", 14267403619509731330ull},
    {"+0x2000000000000400000000001", 5044031582654955522ull},
    {"-0x2000000000000400000000001", 14267403619509731330ull},
    {"+0x20000000000004fffffffffff", 5044031582654955522ull},
    {"-0x20000000000004fffffffffff", 14267403619509731330ull},
    {"+0x2000000000000500000000000", 5044031582654955522ull},
    {"-0x2000000000000500000000000", 14267403619509731330ull},
    {"+0x2000000000000500000000001", 5044031582654955523ull},
    {"-0x2000000000000500000000001", 14267403619509731331ull},
    {"+0x0.000000000000080000000000p-1022", 0ull},
    {"-0x0.000000000000080000000000p-1022", 9223372036854775808ull},
    {"+0x0.000000000000080000000001p-1022", 1ull},
    {"-0x0.000000000000080000000001p-1022", 9223372036854775809ull},
    {"+0x0.0000000000000fffffffffffp-1022", 1ull},
    {"-0x0.0000000000000fffffffffffp-1022", 9223372036854775809ull},
    {"+0x0.000000000000100000000000p-1022", 1ull},
    {"-0x0.000000000000100000000000p-1022", 9223372036854775809ull},
    {"+0x0.000000000000100000000001p-1022", 1ull},
    {"-0x0.000000000000100000000001p-1022", 9223372036854775809ull},
    {"+0x0.00000000000017ffffffffffp-1022", 1ull},
    {"-0x0.00000000000017ffffffffffp-1022", 9223372036854775809ull},
    {"+0x0.000000000000180000000000p-1022", 2ull},
    {"-0x0.000000000000180000000000p-1022", 9223372036854775810ull},
    {"+0x0.000000000000180000000001p-1022", 2ull},
    {"-0x0.000000000000180000000001p-1022", 9223372036854775810ull},
    {"+0x0.0000000000001fffffffffffp-1022", 2ull},
    {"-0x0.0000000000001fffffffffffp-1022", 9223372036854775810ull},
    {"+0x0.000000000000200000000000p-1022", 2ull},
    {"-0x0.000000000000200000000000p-1022", 9223372036854775810ull},
    {"+0x0.000000000000200000000001p-1022", 2ull},
    {"-0x0.000000000000200000000001p-1022", 9223372036854775810ull},
    {"+0x0.00000000000027ffffffffffp-1022", 2ull},
    {"-0x0.00000000000027ffffffffffp-1022", 9223372036854775810ull},
    {"+0x0.000000000000280000000000p-1022", 2ull},
    {"-0x0.000000000000280000000000p-1022", 9223372036854775810ull},
    {"+0x1.000000000000280000000001p-1022", 4503599627370499ull},
    {"-0x1.000000000000280000000001p-1022", 9227875636482146307ull},
    {"+0x1.fffffffffffff4p1023", 9218868437227405311ull},
    {"-0x1.fffffffffffff4p1023", 18442240474082181119ull},
    {"+0x1.fffffffffffff7ffffffp1023", 9218868437227405311ull},
    {"-0x1.fffffffffffff7ffffffp1023", 18442240474082181119ull},
  };

  for (auto test: kTests) {
    AssertHexDoubleEquals(test.output, test.input);
  }
}